

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

token_type mjs::without_assignment(token_type t)

{
  uint uVar1;
  runtime_error *this;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((equal < t) || ((0x3fe001a0U >> (t & lt) & 1) == 0)) {
    __assert_fail("is_assignment_op(t)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  499,"token_type mjs::without_assignment(token_type)");
  }
  uVar1 = t - rshiftshiftequal;
  if ((uVar1 < 0x18) && ((0xff000dU >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(token_type *)(&DAT_0019e300 + (ulong)uVar1 * 4);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_58,t);
  std::operator+(&local_38,"Invalid token type in without_assignment: ",&sStack_58);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool is_assignment_op(token_type t) {
    switch (t) {
    case token_type::equal:
    case token_type::plusequal:
    case token_type::minusequal:
    case token_type::multiplyequal:
    case token_type::divideequal:
    case token_type::modequal:
    case token_type::lshiftequal:
    case token_type::rshiftequal:
    case token_type::rshiftshiftequal:
    case token_type::andequal:
    case token_type::orequal:
    case token_type::xorequal:
        return true;
    default:
        return false;
    }
}